

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O3

adios2_attribute *
adios2_define_variable_attribute_array
          (adios2_io *io,char *name,adios2_type type,void *data,size_t size,char *variable_name,
          char *separator)

{
  Attribute *pAVar1;
  undefined1 *puVar2;
  invalid_argument *piVar3;
  long *plVar4;
  long *plVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arrayStrings;
  allocator local_2aa;
  allocator local_2a9;
  long *local_2a8;
  long local_2a0;
  long local_298;
  long lStack_290;
  size_t local_288;
  char **local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  allocator local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  string local_230;
  string local_210;
  string local_1f0 [16];
  undefined1 local_1e0 [16];
  string local_1d0 [16];
  undefined1 local_1c0 [16];
  string local_1b0 [16];
  undefined1 local_1a0 [16];
  string local_190 [16];
  undefined1 local_180 [16];
  string local_170 [16];
  undefined1 local_160 [16];
  string local_150 [16];
  undefined1 local_140 [16];
  string local_130 [16];
  undefined1 local_120 [16];
  string local_110 [16];
  undefined1 local_100 [16];
  string local_f0 [16];
  undefined1 local_e0 [16];
  string local_d0 [16];
  undefined1 local_c0 [16];
  string local_b0 [16];
  undefined1 local_a0 [16];
  string local_90 [16];
  undefined1 local_80 [16];
  string local_70 [16];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_288 = size;
  local_280 = (char **)data;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"for adios2_io, in call to adios2_define_attribute","");
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_230,"for const void* data, in call to adios2_define_attribute","");
  adios2::helper::CheckForNullptr<void_const>(local_280,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if (local_288 != 0) {
    switch(type) {
    case adios2_type_string:
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<char_const**,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_250,
                 local_280,local_280 + local_288,(allocator_type *)&local_2a8);
      std::__cxx11::string::string((string *)&local_2a8,name,&local_2aa);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2a9);
      std::__cxx11::string::string((string *)local_50,separator,&local_251);
      pAVar1 = adios2::core::IO::DefineAttribute<std::__cxx11::string>
                         (io,&local_2a8,local_250._M_dataplus._M_p,
                          (long)(local_250._M_string_length - (long)local_250._M_dataplus._M_p) >> 5
                          ,&local_278,local_50,0);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      if (local_2a8 != &local_298) {
        operator_delete(local_2a8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_250);
      return (adios2_attribute *)pAVar1;
    case adios2_type_float:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_170,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<float>
                         (io,&local_2a8,local_280,local_288,&local_278,local_170,0);
      puVar2 = local_160;
      break;
    case adios2_type_double:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_190,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<double>
                         (io,&local_2a8,local_280,local_288,&local_278,local_190,0);
      puVar2 = local_180;
      break;
    case adios2_type_float_complex:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_1d0,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<std::complex<float>>
                         (io,&local_2a8,local_280,local_288,&local_278,local_1d0,0);
      puVar2 = local_1c0;
      break;
    case adios2_type_double_complex:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_1f0,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<std::complex<double>>
                         (io,&local_2a8,local_280,local_288,&local_278,local_1f0,0);
      puVar2 = local_1e0;
      break;
    case adios2_type_int8_t:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_70,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<signed_char>
                         (io,&local_2a8,local_280,local_288,&local_278,local_70,0);
      puVar2 = local_60;
      break;
    case adios2_type_int16_t:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_90,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<short>
                         (io,&local_2a8,local_280,local_288,&local_278,local_90,0);
      puVar2 = local_80;
      break;
    case adios2_type_int32_t:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_b0,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<int>
                         (io,&local_2a8,local_280,local_288,&local_278,local_b0,0);
      puVar2 = local_a0;
      break;
    case adios2_type_int64_t:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_d0,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<long>
                         (io,&local_2a8,local_280,local_288,&local_278,local_d0,0);
      puVar2 = local_c0;
      break;
    case adios2_type_uint8_t:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_f0,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<unsigned_char>
                         (io,&local_2a8,local_280,local_288,&local_278,local_f0,0);
      puVar2 = local_e0;
      break;
    case adios2_type_uint16_t:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_110,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<unsigned_short>
                         (io,&local_2a8,local_280,local_288,&local_278,local_110,0);
      puVar2 = local_100;
      break;
    case adios2_type_uint32_t:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_130,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<unsigned_int>
                         (io,&local_2a8,local_280,local_288,&local_278,local_130,0);
      puVar2 = local_120;
      break;
    case adios2_type_uint64_t:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_150,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<unsigned_long>
                         (io,&local_2a8,local_280,local_288,&local_278,local_150,0);
      puVar2 = local_140;
      break;
    case adios2_type_long_double:
      std::__cxx11::string::string((string *)&local_2a8,name,(allocator *)&local_250);
      std::__cxx11::string::string((string *)&local_278,variable_name,&local_2aa);
      std::__cxx11::string::string(local_1b0,separator,&local_2a9);
      pAVar1 = adios2::core::IO::DefineAttribute<long_double>
                         (io,&local_2a8,local_280,local_288,&local_278,local_1b0,0);
      puVar2 = local_1a0;
      break;
    default:
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_250,type);
      std::operator+(&local_278,"ERROR: unsupported type ",&local_250);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
      local_2a8 = (long *)*plVar4;
      plVar5 = plVar4 + 2;
      if (local_2a8 == plVar5) {
        local_298 = *plVar5;
        lStack_290 = plVar4[3];
        local_2a8 = &local_298;
      }
      else {
        local_298 = *plVar5;
      }
      local_2a0 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar3,(string *)&local_2a8);
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (*(undefined1 **)(puVar2 + -0x10) != puVar2) {
      operator_delete(*(undefined1 **)(puVar2 + -0x10));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p);
    }
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8);
    }
    return (adios2_attribute *)pAVar1;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)&local_250,name,&local_2aa);
  std::operator+(&local_278,"ERROR: size of attribute array ",&local_250);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_278);
  local_2a8 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_2a8 == plVar5) {
    local_298 = *plVar5;
    lStack_290 = plVar4[3];
    local_2a8 = &local_298;
  }
  else {
    local_298 = *plVar5;
  }
  local_2a0 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::invalid_argument::invalid_argument(piVar3,(string *)&local_2a8);
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

adios2_attribute *adios2_define_variable_attribute_array(adios2_io *io, const char *name,
                                                         const adios2_type type, const void *data,
                                                         const size_t size,
                                                         const char *variable_name,
                                                         const char *separator)
{
    adios2_attribute *attribute = nullptr;

    try
    {
        adios2::helper::CheckForNullptr(io, "for adios2_io, in call to adios2_define_attribute");

        adios2::helper::CheckForNullptr(data,
                                        "for const void* data, in call to adios2_define_attribute");

        if (size == 0)
        {
            throw std::invalid_argument("ERROR: size of attribute array " + std::string(name) +
                                        " can't be 0,  in call to adios2_define_attribute or "
                                        "adios2_define_variable_attribute");
        }

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        adios2::core::AttributeBase *attributeCpp = nullptr;

        switch (type)
        {
        case (adios2_type_string): {
            const char **char2D = reinterpret_cast<const char **>(const_cast<void *>(data));

            std::vector<std::string> arrayStrings(char2D, char2D + size);

            attributeCpp = &ioCpp.DefineAttribute<std::string>(
                name, arrayStrings.data(), arrayStrings.size(), variable_name, separator);
            break;
        }
#define make_case(adios2_type)                                                                     \
    case (adios2_type): {                                                                          \
        attributeCpp = &ioCpp.DefineAttribute(                                                     \
            name, reinterpret_cast<const MapAdios2Type<adios2_type>::Type *>(data), size,          \
            variable_name, separator);                                                             \
        break;                                                                                     \
    }
            ADIOS2_FOREACH_C_ATTRIBUTE_TYPE_1ARG(make_case)
#undef make_case
        default: {
            throw std::invalid_argument("ERROR: unsupported type " +
                                        std::to_string(static_cast<int>(type)) +
                                        ", see enum adios2_type for acceptable "
                                        "types, in call to "
                                        "adios2_define_attribute_array or "
                                        "adios2_define_variable_attribute_array\n");
        }
        }

        attribute = reinterpret_cast<adios2_attribute *>(attributeCpp);
    }
    catch (...)
    {
        adios2::helper::ExceptionToError("adios2_define_attribute_array or "
                                         "adios_define_variable_attribute_array");
    }
    return attribute;
}